

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q6_K_ref(float *x,block_q6_K *y,int64_t k)

{
  byte bVar1;
  byte bVar2;
  ggml_fp16_t gVar3;
  int iVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  uint8_t q4;
  uint8_t q3;
  uint8_t q2;
  uint8_t q1;
  int l_1;
  int j_1;
  uint8_t *qh;
  uint8_t *ql;
  int l;
  int ii;
  float d;
  int j;
  int ib_1;
  float iscale;
  float abs_scale;
  float scale;
  int ib;
  float max_abs_scale;
  float max_scale;
  int i;
  float scales [16];
  int8_t L [256];
  int64_t nb;
  int local_1c4;
  char local_1c0;
  int local_1bc;
  undefined1 local_1b8;
  int local_1b0;
  int local_1ac;
  long local_1a8;
  long in_stack_fffffffffffffe60;
  int local_194;
  int local_18c;
  int local_188;
  int local_178;
  float local_174;
  float local_170;
  int local_16c;
  float afStack_168 [16];
  byte local_128 [32];
  float *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  int8_t *in_stack_ffffffffffffff08;
  float *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  long local_8;
  
  local_8 = in_RDI;
  for (local_16c = 0; (long)local_16c < in_RDX / 0x100; local_16c = local_16c + 1) {
    local_170 = 0.0;
    local_174 = 0.0;
    for (local_178 = 0; local_178 < 0x10; local_178 = local_178 + 1) {
      fVar5 = make_qx_quants(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                             in_stack_ffffffffffffff04,in_stack_fffffffffffffef8);
      afStack_168[local_178] = fVar5;
      if (local_174 < ABS(fVar5)) {
        local_174 = ABS(fVar5);
        local_170 = fVar5;
      }
    }
    fVar5 = (float)((ulong)in_stack_fffffffffffffe60 >> 0x20);
    if (1e-15 <= local_174) {
      gVar3 = ggml_compute_fp32_to_fp16(fVar5);
      *(ggml_fp16_t *)(in_RSI + (long)local_16c * 0xd2 + 0xd0) = gVar3;
      for (local_188 = 0; local_188 < 0x10; local_188 = local_188 + 1) {
        iVar4 = nearest_int((-128.0 / local_170) * afStack_168[local_188]);
        if (iVar4 < 0x80) {
          iVar4 = nearest_int((-128.0 / local_170) * afStack_168[local_188]);
          local_1b8 = (undefined1)iVar4;
        }
        else {
          local_1b8 = 0x7f;
        }
        *(undefined1 *)(in_RSI + (long)local_16c * 0xd2 + 0xc0 + (long)local_188) = local_1b8;
      }
      for (local_18c = 0; local_18c < 0x10; local_18c = local_18c + 1) {
        fVar5 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RSI + (long)local_16c * 0xd2 + 0xd0));
        fVar5 = fVar5 * (float)(int)*(char *)(in_RSI + (long)local_16c * 0xd2 + 0xc0 +
                                             (long)local_18c);
        if ((fVar5 != 0.0) || (NAN(fVar5))) {
          for (local_194 = 0; local_194 < 0x10; local_194 = local_194 + 1) {
            local_1c4 = nearest_int(*(float *)(local_8 + (long)(local_18c * 0x10 + local_194) * 4) /
                                    fVar5);
            local_1bc = local_1c4;
            if (0x1f < local_1c4) {
              local_1bc = 0x1f;
            }
            if (local_1bc < -0x20) {
              local_1c0 = -0x20;
            }
            else {
              if (0x1f < local_1c4) {
                local_1c4 = 0x1f;
              }
              local_1c0 = (char)local_1c4;
            }
            local_128[local_18c * 0x10 + local_194] = local_1c0 + 0x20;
          }
        }
      }
      in_stack_fffffffffffffe60 = in_RSI + (long)local_16c * 0xd2;
      local_1a8 = in_RSI + (long)local_16c * 0xd2 + 0x80;
      for (local_1ac = 0; local_1ac < 0x100; local_1ac = local_1ac + 0x80) {
        for (local_1b0 = 0; local_1b0 < 0x20; local_1b0 = local_1b0 + 1) {
          bVar1 = local_128[local_1ac + local_1b0 + 0x20];
          bVar2 = local_128[local_1ac + local_1b0 + 0x60];
          *(byte *)(in_stack_fffffffffffffe60 + local_1b0) =
               local_128[local_1ac + local_1b0] & 0xf | local_128[local_1ac + local_1b0 + 0x40] << 4
          ;
          *(byte *)(in_stack_fffffffffffffe60 + (local_1b0 + 0x20)) = bVar1 & 0xf | bVar2 << 4;
          *(byte *)(local_1a8 + local_1b0) =
               (char)local_128[local_1ac + local_1b0] >> 4 |
               (byte)(((int)(char)local_128[local_1ac + local_1b0 + 0x20] >> 4) << 2) |
               (byte)(((int)(char)local_128[local_1ac + local_1b0 + 0x40] >> 4) << 4) |
               (byte)(((int)(char)local_128[local_1ac + local_1b0 + 0x60] >> 4) << 6);
        }
        in_stack_fffffffffffffe60 = in_stack_fffffffffffffe60 + 0x40;
        local_1a8 = local_1a8 + 0x20;
      }
    }
    else {
      memset((void *)(in_RSI + (long)local_16c * 0xd2),0,0xd2);
      gVar3 = ggml_compute_fp32_to_fp16(fVar5);
      *(ggml_fp16_t *)(in_RSI + (long)local_16c * 0xd2 + 0xd0) = gVar3;
    }
    local_8 = local_8 + 0x400;
  }
  return;
}

Assistant:

void quantize_row_q6_K_ref(const float * GGML_RESTRICT x, block_q6_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    int8_t L[QK_K];
    float   scales[QK_K/16];

    for (int i = 0; i < nb; i++) {

        float max_scale = 0;
        float max_abs_scale = 0;

        for (int ib = 0; ib < QK_K/16; ++ib) {

            const float scale = make_qx_quants(16, 32, x + 16*ib, L + 16*ib, 1, NULL);
            scales[ib] = scale;

            const float abs_scale = fabsf(scale);
            if (abs_scale > max_abs_scale) {
                max_abs_scale = abs_scale;
                max_scale = scale;
            }

        }

        if (max_abs_scale < GROUP_MAX_EPS) {
            memset(&y[i], 0, sizeof(block_q6_K));
            y[i].d = GGML_FP32_TO_FP16(0.f);
            x += QK_K;
            continue;
        }

        float iscale = -128.f/max_scale;
        y[i].d = GGML_FP32_TO_FP16(1/iscale);
        for (int ib = 0; ib < QK_K/16; ++ib) {
            y[i].scales[ib] = MIN(127, nearest_int(iscale*scales[ib]));
        }

        for (int j = 0; j < QK_K/16; ++j) {
            float d = GGML_FP16_TO_FP32(y[i].d) * y[i].scales[j];
            if (!d) {
                continue;
            }
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int(x[16*j + ii]/d);
                l = MAX(-32, MIN(31, l));
                L[16*j + ii] = l + 32;
            }
        }

        uint8_t * GGML_RESTRICT ql = y[i].ql;
        uint8_t * GGML_RESTRICT qh = y[i].qh;
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                const uint8_t q1 = L[j + l +  0] & 0xF;
                const uint8_t q2 = L[j + l + 32] & 0xF;
                const uint8_t q3 = L[j + l + 64] & 0xF;
                const uint8_t q4 = L[j + l + 96] & 0xF;
                ql[l+ 0] = q1 | (q3 << 4);
                ql[l+32] = q2 | (q4 << 4);
                qh[l] = (L[j + l] >> 4) | ((L[j + l + 32] >> 4) << 2) | ((L[j + l + 64] >> 4) << 4) | ((L[j + l + 96] >> 4) << 6);
            }
            ql += 64;
            qh += 32;
        }

        x += QK_K;
    }
}